

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiViewportP *
ImGui::AddUpdateViewport
          (ImGuiWindow *window,ImGuiID id,ImVec2 *pos,ImVec2 *size,ImGuiViewportFlags flags)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiContext *pIVar7;
  ImGuiViewportP *this;
  ImGuiPlatformMonitor *pIVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ImGuiViewportP *viewport;
  ImGuiViewportP *local_40;
  ImVec2 *local_38;
  
  pIVar7 = GImGui;
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2f0d,
                  "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
                 );
  }
  uVar9 = flags | 1;
  if (window != (ImGuiWindow *)0x0) {
    if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) &&
       (GImGui->MovingWindow->RootWindowDockTree == window)) {
      uVar9 = flags | 0xa1;
    }
    uVar10 = uVar9 | 0x80;
    if ((~window->Flags & 0x40200U) != 0) {
      uVar10 = uVar9;
    }
    uVar9 = (uint)window->Flags >> 7 & 0x20 | uVar10;
  }
  local_40 = (ImGuiViewportP *)FindViewportByID(id);
  if (local_40 == (ImGuiViewportP *)0x0) {
    this = (ImGuiViewportP *)MemAlloc(0x130);
    local_38 = size;
    ImGuiViewportP::ImGuiViewportP(this);
    (this->super_ImGuiViewport).ID = id;
    *(int *)&(this->super_ImGuiViewport).field_0x5c = (pIVar7->Viewports).Size;
    IVar2 = *pos;
    this->LastPos = IVar2;
    (this->super_ImGuiViewport).Pos = IVar2;
    (this->super_ImGuiViewport).Size = *local_38;
    (this->super_ImGuiViewport).Flags = uVar9;
    local_40 = this;
    UpdateViewportPlatformMonitor(this);
    ImVector<ImGuiViewportP_*>::push_back(&pIVar7->Viewports,&local_40);
    IVar2 = (local_40->super_ImGuiViewport).Pos;
    IVar1 = (local_40->super_ImGuiViewport).Size;
    fVar13 = IVar2.x;
    fVar15 = IVar1.x + fVar13;
    fVar14 = IVar2.y;
    fVar16 = IVar1.y + fVar14;
    fVar3 = (pIVar7->DrawListSharedData).ClipRectFullscreen.x;
    fVar4 = (pIVar7->DrawListSharedData).ClipRectFullscreen.y;
    fVar5 = (pIVar7->DrawListSharedData).ClipRectFullscreen.z;
    fVar6 = (pIVar7->DrawListSharedData).ClipRectFullscreen.w;
    uVar9 = -(uint)(fVar3 < fVar13);
    uVar10 = -(uint)(fVar4 < fVar14);
    uVar11 = -(uint)(fVar15 <= fVar5);
    uVar12 = -(uint)(fVar16 <= fVar6);
    (pIVar7->DrawListSharedData).ClipRectFullscreen.x =
         (float)(~uVar9 & (uint)fVar13 | (uint)fVar3 & uVar9);
    (pIVar7->DrawListSharedData).ClipRectFullscreen.y =
         (float)(~uVar10 & (uint)fVar14 | (uint)fVar4 & uVar10);
    (pIVar7->DrawListSharedData).ClipRectFullscreen.z =
         (float)(~uVar11 & (uint)fVar15 | (uint)fVar5 & uVar11);
    (pIVar7->DrawListSharedData).ClipRectFullscreen.w =
         (float)(~uVar12 & (uint)fVar16 | (uint)fVar6 & uVar12);
    if (local_40->PlatformMonitor != -1) {
      pIVar8 = ImVector<ImGuiPlatformMonitor>::operator[]
                         (&(pIVar7->PlatformIO).Monitors,(int)local_40->PlatformMonitor);
      (local_40->super_ImGuiViewport).DpiScale = pIVar8->DpiScale;
    }
  }
  else {
    if ((local_40->super_ImGuiViewport).PlatformRequestMove == false) {
      (local_40->super_ImGuiViewport).Pos = *pos;
    }
    if ((local_40->super_ImGuiViewport).PlatformRequestResize == false) {
      (local_40->super_ImGuiViewport).Size = *size;
    }
    (local_40->super_ImGuiViewport).Flags = (local_40->super_ImGuiViewport).Flags & 0x400U | uVar9;
  }
  local_40->Window = window;
  local_40->LastFrameActive = pIVar7->FrameCount;
  ImGuiViewportP::UpdateWorkRect(local_40);
  if (window != (ImGuiWindow *)0x0) {
    if ((local_40->super_ImGuiViewport).ID != window->ID) {
      __assert_fail("window == __null || viewport->ID == window->ID",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x2f40,
                    "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
                   );
    }
    window->ViewportOwned = true;
  }
  return local_40;
}

Assistant:

ImGuiViewportP* ImGui::AddUpdateViewport(ImGuiWindow* window, ImGuiID id, const ImVec2& pos, const ImVec2& size, ImGuiViewportFlags flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    flags |= ImGuiViewportFlags_IsPlatformWindow;
    if (window != NULL)
    {
        if (g.MovingWindow && g.MovingWindow->RootWindowDockTree == window)
            flags |= ImGuiViewportFlags_NoInputs | ImGuiViewportFlags_NoFocusOnAppearing;
        if ((window->Flags & ImGuiWindowFlags_NoMouseInputs) && (window->Flags & ImGuiWindowFlags_NoNavInputs))
            flags |= ImGuiViewportFlags_NoInputs;
        if (window->Flags & ImGuiWindowFlags_NoFocusOnAppearing)
            flags |= ImGuiViewportFlags_NoFocusOnAppearing;
    }

    ImGuiViewportP* viewport = (ImGuiViewportP*)FindViewportByID(id);
    if (viewport)
    {
        if (!viewport->PlatformRequestMove)
            viewport->Pos = pos;
        if (!viewport->PlatformRequestResize)
            viewport->Size = size;
        viewport->Flags = flags | (viewport->Flags & ImGuiViewportFlags_Minimized); // Preserve existing flags
    }
    else
    {
        // New viewport
        viewport = IM_NEW(ImGuiViewportP)();
        viewport->ID = id;
        viewport->Idx = g.Viewports.Size;
        viewport->Pos = viewport->LastPos = pos;
        viewport->Size = size;
        viewport->Flags = flags;
        UpdateViewportPlatformMonitor(viewport);
        g.Viewports.push_back(viewport);
        IMGUI_DEBUG_LOG_VIEWPORT("Add Viewport %08X (%s)\n", id, window->Name);

        // We normally setup for all viewports in NewFrame() but here need to handle the mid-frame creation of a new viewport.
        // We need to extend the fullscreen clip rect so the OverlayDrawList clip is correct for that the first frame
        g.DrawListSharedData.ClipRectFullscreen.x = ImMin(g.DrawListSharedData.ClipRectFullscreen.x, viewport->Pos.x);
        g.DrawListSharedData.ClipRectFullscreen.y = ImMin(g.DrawListSharedData.ClipRectFullscreen.y, viewport->Pos.y);
        g.DrawListSharedData.ClipRectFullscreen.z = ImMax(g.DrawListSharedData.ClipRectFullscreen.z, viewport->Pos.x + viewport->Size.x);
        g.DrawListSharedData.ClipRectFullscreen.w = ImMax(g.DrawListSharedData.ClipRectFullscreen.w, viewport->Pos.y + viewport->Size.y);

        // Store initial DpiScale before the OS platform window creation, based on expected monitor data.
        // This is so we can select an appropriate font size on the first frame of our window lifetime
        if (viewport->PlatformMonitor != -1)
            viewport->DpiScale = g.PlatformIO.Monitors[viewport->PlatformMonitor].DpiScale;
    }

    viewport->Window = window;
    viewport->LastFrameActive = g.FrameCount;
    viewport->UpdateWorkRect();
    IM_ASSERT(window == NULL || viewport->ID == window->ID);

    if (window != NULL)
        window->ViewportOwned = true;

    return viewport;
}